

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int attlist2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ulong uVar1;
  int iVar2;
  code *pcVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  iVar4 = 0x21;
  if (tok == 0xf) {
    return 0x21;
  }
  if (tok == 0x17) {
    pcVar3 = attlist3;
  }
  else {
    if (tok == 0x12) {
      iVar2 = (*enc->nameMatchesAscii)(enc,ptr,end,"CDATA");
      if (iVar2 == 0) {
        uVar1 = 0;
        do {
          uVar5 = uVar1;
          bVar6 = 6 < uVar5;
          if (uVar5 == 7) {
            iVar2 = 7;
            goto LAB_0045f7a6;
          }
          iVar2 = (*enc->nameMatchesAscii)
                            (enc,ptr,end,
                             attlist2_types_rel + *(int *)(attlist2_types_rel + uVar5 * 4 + 4));
          uVar1 = uVar5 + 1;
        } while (iVar2 == 0);
        bVar6 = 6 < uVar5;
        iVar2 = (int)(uVar5 + 1) + 0x17;
      }
      else {
        iVar2 = 0x17;
        bVar6 = false;
      }
      state->handler = attlist8;
LAB_0045f7a6:
      if (!bVar6) {
        return iVar2;
      }
      iVar2 = (*enc->nameMatchesAscii)(enc,ptr,end,"NOTATION");
      if (iVar2 != 0) {
        pcVar3 = attlist5;
        goto LAB_0045f7d7;
      }
    }
    iVar4 = -1;
    pcVar3 = error;
  }
LAB_0045f7d7:
  state->handler = pcVar3;
  return iVar4;
}

Assistant:

static int PTRCALL
attlist2(PROLOG_STATE *state,
         int tok,
         const char *ptr,
         const char *end,
         const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME:
    {
      static const char * const types[] = {
        KW_CDATA,
        KW_ID,
        KW_IDREF,
        KW_IDREFS,
        KW_ENTITY,
        KW_ENTITIES,
        KW_NMTOKEN,
        KW_NMTOKENS,
      };
      int i;
      for (i = 0; i < (int)(sizeof(types)/sizeof(types[0])); i++)
        if (XmlNameMatchesAscii(enc, ptr, end, types[i])) {
          state->handler = attlist8;
          return XML_ROLE_ATTRIBUTE_TYPE_CDATA + i;
        }
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NOTATION)) {
      state->handler = attlist5;
      return XML_ROLE_ATTLIST_NONE;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->handler = attlist3;
    return XML_ROLE_ATTLIST_NONE;
  }
  return common(state, tok);
}